

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttf.c
# Opt level: O0

void cache_glyph(ALLEGRO_TTF_FONT_DATA *font_data,FT_Face_conflict face,int ft_index,
                ALLEGRO_TTF_GLYPH_DATA *glyph,_Bool lock_whole_page)

{
  int iVar1;
  ulong uVar2;
  ALLEGRO_TTF_FONT_DATA *data;
  long *in_RCX;
  undefined4 in_EDX;
  FT_Face_conflict in_RSI;
  ALLEGRO_TTF_FONT_DATA *in_RDI;
  byte in_R8B;
  uchar *glyph_data;
  ALLEGRO_TTF_GLYPH_DATA *in_stack_00000010;
  int h;
  int w;
  FT_Error e;
  FT_Int32 ft_load_flags;
  undefined3 in_stack_00000024;
  uint local_28;
  
  if ((*in_RCX == 0) && (-1 < (short)in_RCX[1])) {
    local_28 = 0xc;
    if ((in_RDI->flags & 2U) != 0) {
      local_28 = 0x2000c;
    }
    if ((in_RDI->flags & 4U) != 0) {
      local_28 = local_28 | 0x8000;
    }
    iVar1 = FT_Load_Glyph(in_RSI,in_EDX,local_28);
    if ((iVar1 != 0) &&
       (uVar2 = _al_trace_prefix(__al_debug_channel,2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/ttf/ttf.c"
                                 ,0x1af,"cache_glyph"), (uVar2 & 1) != 0)) {
      _al_trace_suffix("Failed loading glyph %d from.\n",in_EDX);
    }
    *(short *)(in_RCX + 2) = (short)in_RSI->glyph->bitmap_left;
    *(short *)((long)in_RCX + 0x12) =
         (short)((in_RSI->size->metrics).ascender >> 6) - (short)in_RSI->glyph->bitmap_top;
    *(short *)((long)in_RCX + 0x14) = (short)((in_RSI->glyph->advance).x >> 6);
    if (((in_RSI->glyph->bitmap).width == 0) || ((in_RSI->glyph->bitmap).rows == 0)) {
      *(undefined2 *)(in_RCX + 1) = 0xffff;
      *(undefined2 *)((long)in_RCX + 10) = 0xffff;
      uVar2 = _al_trace_prefix(__al_debug_channel,0,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/ttf/ttf.c"
                               ,0x1bd,"cache_glyph");
      if ((uVar2 & 1) != 0) {
        _al_trace_suffix("Glyph %d has zero size.\n",in_EDX);
      }
    }
    else {
      data = (ALLEGRO_TTF_FONT_DATA *)
             alloc_glyph_region((ALLEGRO_TTF_FONT_DATA *)glyph,_in_stack_00000024,ft_load_flags,e,
                                w._3_1_,in_stack_00000010,glyph_data._7_1_);
      if (data != (ALLEGRO_TTF_FONT_DATA *)0x0) {
        if ((in_RDI->flags & 2U) == 0) {
          copy_glyph_color(in_RDI,in_RSI,(uchar *)data);
        }
        else {
          copy_glyph_mono(in_RDI,in_RSI,(uchar *)data);
        }
        if ((in_R8B & 1) == 0) {
          unlock_current_page(data);
        }
      }
    }
  }
  return;
}

Assistant:

static void cache_glyph(ALLEGRO_TTF_FONT_DATA *font_data, FT_Face face,
   int ft_index, ALLEGRO_TTF_GLYPH_DATA *glyph, bool lock_whole_page)
{
    FT_Int32 ft_load_flags;
    FT_Error e;
    int w, h;
    unsigned char *glyph_data;

    if (glyph->page_bitmap || glyph->region.x < 0)
        return;
   
    /* We shouldn't ever get here, as cache misses
     * should have been set to ft_index = 0. */
    ASSERT(!(font_data->skip_cache_misses && !lock_whole_page));

    // FIXME: make this a config setting? FT_LOAD_FORCE_AUTOHINT

    // FIXME: Investigate why some fonts don't work without the
    // NO_BITMAP flags. Supposedly using that flag makes small sizes
    // look bad so ideally we would not used it.
    ft_load_flags = FT_LOAD_RENDER | FT_LOAD_NO_BITMAP;
    if (font_data->flags & ALLEGRO_TTF_MONOCHROME)
       ft_load_flags |= FT_LOAD_TARGET_MONO;
    if (font_data->flags & ALLEGRO_TTF_NO_AUTOHINT)
       ft_load_flags |= FT_LOAD_NO_AUTOHINT;

    e = FT_Load_Glyph(face, ft_index, ft_load_flags);
    if (e) {
       ALLEGRO_WARN("Failed loading glyph %d from.\n", ft_index);
    }

    glyph->offset_x = face->glyph->bitmap_left;
    glyph->offset_y = (face->size->metrics.ascender >> 6) - face->glyph->bitmap_top;
    glyph->advance = face->glyph->advance.x >> 6;

    w = face->glyph->bitmap.width;
    h = face->glyph->bitmap.rows;

    if (w == 0 || h == 0) {
       /* Mark this glyph so we won't try to cache it next time. */
       glyph->region.x = -1;
       glyph->region.y = -1;
       ALLEGRO_DEBUG("Glyph %d has zero size.\n", ft_index);
       return;
    }

    /* Each glyph has a 1-pixel border all around. Note: The border is kept
     * even against the outer bitmap edge, to ensure consistent rendering.
     */
    glyph_data = alloc_glyph_region(font_data, ft_index,
       w + 2, h + 2, false, glyph, lock_whole_page);

    if (glyph_data == NULL) {
       return;
    }

    if (font_data->flags & ALLEGRO_TTF_MONOCHROME)
       copy_glyph_mono(font_data, face, glyph_data);
    else
       copy_glyph_color(font_data, face, glyph_data);

    if (!lock_whole_page) {
       unlock_current_page(font_data);
    }
}